

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O1

void __thiscall
asio::detail::epoll_reactor::
remove_timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue)

{
  bool bVar1;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *ptVar2;
  timer_queue_set *ptVar3;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *ptVar4;
  
  bVar1 = (this->mutex_).enabled_;
  if (bVar1 == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(this->mutex_).mutex_);
  }
  ptVar2 = (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *)(this->timer_queues_).first_;
  if (ptVar2 != (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                 *)0x0) {
    if (ptVar2 == queue) {
      ptVar3 = &this->timer_queues_;
    }
    else {
      do {
        ptVar4 = ptVar2;
        ptVar2 = (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                  *)(ptVar4->super_timer_queue_base).next_;
        if (ptVar2 == (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                       *)0x0) goto LAB_002acd0b;
      } while (ptVar2 != queue);
      ptVar3 = (timer_queue_set *)&(ptVar4->super_timer_queue_base).next_;
    }
    ptVar3->first_ = (queue->super_timer_queue_base).next_;
    (queue->super_timer_queue_base).next_ = (timer_queue_base *)0x0;
  }
LAB_002acd0b:
  if (bVar1 != false) {
    pthread_mutex_unlock((pthread_mutex_t *)&(this->mutex_).mutex_);
    return;
  }
  return;
}

Assistant:

void epoll_reactor::remove_timer_queue(timer_queue<Time_Traits>& queue)
{
  do_remove_timer_queue(queue);
}